

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O3

double cvui::internal::counter
                 (cvui_block_t *theBlock,int theX,int theY,double *theValue,double theStep,
                 char *theFormat)

{
  bool bVar1;
  size_t sVar2;
  Rect aContentArea;
  String local_70;
  double local_50;
  Rect local_48;
  Size local_38;
  
  local_48.x = theX + 0x16;
  local_48.width = 0x30;
  local_48.height = 0x16;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50 = theStep;
  local_48.y = theY;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"-","");
  bVar1 = button(theBlock,theX,theY,0x16,0x16,&local_70,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    *theValue = *theValue - local_50;
  }
  sprintf(gBuffer,theFormat);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  sVar2 = strlen(gBuffer);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,gBuffer,gBuffer + sVar2);
  render::counter(theBlock,&local_48,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"+","");
  bVar1 = button(theBlock,theX + 0x46,theY,0x16,0x16,&local_70,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    *theValue = local_50 + *theValue;
  }
  local_38.width = 0x5c;
  local_38.height = 0x16;
  updateLayoutFlow(theBlock,&local_38);
  return *theValue;
}

Assistant:

double counter(cvui_block_t& theBlock, int theX, int theY, double *theValue, double theStep, const char *theFormat) {
		cv::Rect aContentArea(theX + 22, theY, 48, 22);

		if (internal::button(theBlock, theX, theY, 22, 22, "-", false)) {
			*theValue -= theStep;
		}

		sprintf_s(internal::gBuffer, theFormat, *theValue);
		render::counter(theBlock, aContentArea, internal::gBuffer);

		if (internal::button(theBlock, aContentArea.x + aContentArea.width, theY, 22, 22, "+", false)) {
			*theValue += theStep;
		}

		// Update the layout flow
		cv::Size aSize(22 * 2 + aContentArea.width, aContentArea.height);
		updateLayoutFlow(theBlock, aSize);

		return *theValue;
	}